

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O2

void crnlib::split_vectors<crnlib::vec<1u,float>>
               (vec<1U,_float> (*vectors) [64],uint (*weights) [64],uint size,
               vec<1U,_float> (*result) [2])

{
  double dVar1;
  uint i;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  uint i_3;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  double dVar11;
  undefined8 uVar12;
  float fVar13;
  float in_XMM3_Db;
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  vec<1U,_float> local_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [16];
  vec<1U,_float> weightedVectors [64];
  double weightedDotProducts [64];
  
  uVar6 = (ulong)size;
  dVar1 = 0.0;
  fVar13 = 0.0;
  uVar3 = 0;
  for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    uVar8 = (*weights)[uVar4];
    fVar9 = (float)uVar8;
    fVar10 = (*vectors)[uVar4].m_s[0];
    fVar15 = fVar10 * fVar9;
    weightedVectors[uVar4].m_s[0] = fVar15;
    fVar13 = fVar13 + fVar15;
    uVar3 = uVar3 + uVar8;
    in_XMM3_Db = 0.0;
    dVar11 = (double)(fVar10 * fVar10 * fVar9);
    weightedDotProducts[uVar4] = dVar11;
    dVar1 = dVar1 + dVar11;
  }
  fVar10 = 1.0 / (float)uVar3;
  fVar9 = fVar13 * fVar10;
  (*result)[1].m_s[0] = fVar9;
  (*result)[0].m_s[0] = fVar9;
  if (size != 1) {
    dVar1 = dVar1 - (double)(fVar13 * fVar13 * fVar10);
    fVar15 = (float)((ulong)dVar1 >> 0x20);
    fVar13 = (float)dVar1;
    if (0.0 < fVar13) {
      fVar18 = -1.0;
      fVar20 = (float)uVar3;
      for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
        fVar20 = (*vectors)[uVar4].m_s[0];
        fVar16 = fVar20 - fVar9;
        fVar16 = fVar16 * fVar16;
        fVar19 = 0.0;
        if (fVar16 <= fVar18) {
          fVar20 = fVar13;
          fVar19 = fVar15;
        }
        fVar15 = fVar19;
        fVar13 = fVar20;
        if (fVar18 <= fVar16) {
          fVar18 = fVar16;
        }
        fVar20 = fVar13;
        in_XMM3_Db = fVar15;
      }
      fVar18 = -1.0;
      for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
        fVar19 = (*vectors)[uVar3].m_s[0];
        fVar17 = fVar19 - fVar13;
        fVar17 = fVar17 * fVar17;
        fVar16 = 0.0;
        if (fVar17 <= fVar18) {
          fVar19 = fVar20;
          fVar16 = in_XMM3_Db;
        }
        if (fVar18 <= fVar17) {
          fVar18 = fVar17;
        }
        fVar20 = fVar19;
        in_XMM3_Db = fVar16;
      }
      local_358 = (fVar9 + fVar13) * 0.5;
      fStack_354 = (fVar9 + fVar20) * 0.5;
      fStack_350 = (fVar9 + fVar15) * 0.0;
      fStack_34c = (fVar9 + in_XMM3_Db) * 0.0;
      fVar13 = local_358;
      fVar15 = fStack_354;
      if (2 < size) {
        fVar13 = 0.0;
        for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
          fVar15 = (*vectors)[uVar3].m_s[0] - fVar9;
          fVar13 = fVar13 + fVar15 * fVar15 * (float)(*weights)[uVar3];
        }
        iVar2 = 10;
        local_35c.m_s[0] = (float  [1])1.0;
        while (bVar7 = iVar2 != 0, iVar2 = iVar2 + -1, bVar7) {
          fVar15 = (float)local_35c.m_s[0] * fVar13 * fVar10;
          uVar8 = -(uint)(fVar15 != 0.0);
          local_35c.m_s[0] = (float  [1])(uVar8 & 0x3f800000 | ~uVar8 & (uint)fVar15);
        }
        uVar3 = 0;
        local_348 = ZEXT416((uint)fVar9);
        vec<1U,_float>::normalize(&local_35c,(vec<1U,_float> *)0x0);
        dVar1 = 0.0;
        dVar11 = 0.0;
        uVar12 = 0;
        while( true ) {
          fVar10 = (float)uVar12;
          fVar9 = (float)((ulong)uVar12 >> 0x20);
          if (uVar6 == uVar3) break;
          if (0.0 <= ((*vectors)[uVar3].m_s[0] - (float)local_348._0_4_) * (float)local_35c.m_s[0])
          {
            dVar11 = dVar11 + (double)(*weights)[uVar3];
            uVar12 = CONCAT44(weightedVectors[uVar3].m_s[0] + fVar9,fVar10);
          }
          else {
            uVar12 = CONCAT44(fVar9,fVar10 + weightedVectors[uVar3].m_s[0]);
            dVar1 = dVar1 + (double)(*weights)[uVar3];
          }
          uVar3 = uVar3 + 1;
        }
        fVar13 = local_358;
        fVar15 = fStack_354;
        if (0.0 < dVar11) {
          auVar14._8_4_ = SUB84(dVar11,0);
          auVar14._0_8_ = dVar1;
          auVar14._12_4_ = (int)((ulong)dVar11 >> 0x20);
          auVar14 = divpd(_DAT_001896e0,auVar14);
          fVar13 = fVar10 * (float)auVar14._0_8_;
          fVar15 = fVar9 * (float)auVar14._8_8_;
        }
        if (dVar1 <= 0.0) {
          fVar13 = local_358;
          fVar15 = fStack_354;
        }
      }
      iVar2 = 0;
      fVar10 = 1e+10;
      while (iVar2 != 0x400) {
        dVar11 = 0.0;
        fVar9 = 0.0;
        fVar18 = 0.0;
        uVar4 = 0;
        uVar3 = 0;
        dVar1 = 0.0;
        for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
          fVar20 = (*vectors)[uVar5].m_s[0];
          fVar19 = fVar13 - fVar20;
          fVar20 = fVar15 - fVar20;
          if (fVar20 * fVar20 <= fVar19 * fVar19) {
            fVar18 = fVar18 + weightedVectors[uVar5].m_s[0];
            dVar1 = dVar1 + weightedDotProducts[uVar5];
            uVar3 = uVar3 + (*weights)[uVar5];
          }
          else {
            fVar9 = fVar9 + weightedVectors[uVar5].m_s[0];
            dVar11 = dVar11 + weightedDotProducts[uVar5];
            uVar4 = uVar4 + (*weights)[uVar5];
          }
        }
        if (uVar4 == 0) {
          return;
        }
        if (uVar3 == 0) {
          return;
        }
        fVar20 = (float)(dVar1 - (double)(fVar18 * fVar18 * (1.0 / (float)uVar3))) +
                 (float)(dVar11 - (double)(fVar9 * fVar9 * (1.0 / (float)uVar4)));
        fVar13 = (1.0 / (float)uVar4) * fVar9;
        fVar15 = (1.0 / (float)uVar3) * fVar18;
        if ((fVar20 < 1e-05) ||
           (fVar9 = fVar10 - fVar20, iVar2 = iVar2 + 1, fVar10 = fVar20, fVar9 / fVar20 < 1e-05))
        break;
      }
      (*result)[0].m_s[0] = fVar13;
      (*result)[1].m_s[0] = fVar15;
    }
  }
  return;
}

Assistant:

void split_vectors(VectorType (&vectors)[64], uint (&weights)[64], uint size, VectorType (&result)[2]) {
  VectorType weightedVectors[64];
  double weightedDotProducts[64];
  VectorType centroid(cClear);
  uint64 total_weight = 0;
  double ttsum = 0.0f;
  for (uint i = 0; i < size; i++) {
    const VectorType& v = vectors[i];
    const uint weight = weights[i];
    weightedVectors[i] = v * (float)weight;
    centroid += weightedVectors[i];
    total_weight += weight;
    weightedDotProducts[i] = v.dot(v) * weight;
    ttsum += weightedDotProducts[i];
  }
  float variance = (float)(ttsum - (centroid.dot(centroid) / total_weight));
  centroid *= (1.0f / total_weight);
  result[0] = result[1] = centroid;
  if (variance <= 0.0f || size == 1)
    return;
  VectorType furthest;
  double furthest_dist = -1.0f;
  for (uint i = 0; i < size; i++) {
    const VectorType& v = vectors[i];
    double dist = v.squared_distance(centroid);
    if (dist > furthest_dist) {
      furthest_dist = dist;
      furthest = v;
    }
  }
  VectorType opposite;
  double opposite_dist = -1.0f;
  for (uint i = 0; i < size; i++) {
    const VectorType& v = vectors[i];
    double dist = v.squared_distance(furthest);
    if (dist > opposite_dist) {
      opposite_dist = dist;
      opposite = v;
    }
  }
  VectorType left_child((furthest + centroid) * .5f);
  VectorType right_child((opposite + centroid) * .5f);
  if (size > 2) {
    const uint N = VectorType::num_elements;
    matrix<N, N, float> covar;
    covar.clear();
    for (uint i = 0; i < size; i++) {
      const VectorType& v = vectors[i] - centroid;
      const VectorType w = v * (float)weights[i];
      for (uint x = 0; x < N; x++) {
        for (uint y = x; y < N; y++)
          covar[x][y] = covar[x][y] + v[x] * w[y];
      }
    }
    float divider = (float)total_weight;
    for (uint x = 0; x < N; x++) {
      for (uint y = x; y < N; y++) {
        covar[x][y] /= divider;
        covar[y][x] = covar[x][y];
      }
    }
    VectorType axis(1.0f);
    for (uint iter = 0; iter < 10; iter++) {
      VectorType x;
      double max_sum = 0;
      for (uint i = 0; i < N; i++) {
        double sum = 0;
        for (uint j = 0; j < N; j++)
          sum += axis[j] * covar[i][j];
        x[i] = (float)sum;
        max_sum = i ? math::maximum(max_sum, sum) : sum;
      }
      if (max_sum != 0.0f)
        x *= (float)(1.0f / max_sum);
      axis = x;
    }
    axis.normalize();
    VectorType new_left_child(0.0f);
    VectorType new_right_child(0.0f);
    double left_weight = 0.0f;
    double right_weight = 0.0f;
    for (uint i = 0; i < size; i++) {
      const VectorType& v = vectors[i];
      const float weight = (float)weights[i];
      double t = (v - centroid) * axis;
      if (t < 0.0f) {
        new_left_child += weightedVectors[i];
        left_weight += weight;
      } else {
        new_right_child += weightedVectors[i];
        right_weight += weight;
      }
    }
    if ((left_weight > 0.0f) && (right_weight > 0.0f)) {
      left_child = new_left_child * (float)(1.0f / left_weight);
      right_child = new_right_child * (float)(1.0f / right_weight);
    }
  }
  uint64 left_weight = 0;
  uint64 right_weight = 0;
  float prev_total_variance = 1e+10f;
  float left_variance = 0.0f;
  float right_variance = 0.0f;
  const uint cMaxLoops = 1024;
  for (uint total_loops = 0; total_loops < cMaxLoops; total_loops++) {
    VectorType new_left_child(cClear);
    VectorType new_right_child(cClear);
    double left_ttsum = 0.0f;
    double right_ttsum = 0.0f;
    left_weight = 0;
    right_weight = 0;
    for (uint i = 0; i < size; i++) {
      const VectorType& v = vectors[i];
      double left_dist2 = left_child.squared_distance(v);
      double right_dist2 = right_child.squared_distance(v);
      if (left_dist2 < right_dist2) {
        new_left_child += weightedVectors[i];
        left_ttsum += weightedDotProducts[i];
        left_weight += weights[i];
      } else {
        new_right_child += weightedVectors[i];
        right_ttsum += weightedDotProducts[i];
        right_weight += weights[i];
      }
    }
    if ((!left_weight) || (!right_weight))
      return;
    left_variance = (float)(left_ttsum - (new_left_child.dot(new_left_child) / left_weight));
    right_variance = (float)(right_ttsum - (new_right_child.dot(new_right_child) / right_weight));
    new_left_child *= (1.0f / left_weight);
    new_right_child *= (1.0f / right_weight);
    left_child = new_left_child;
    right_child = new_right_child;
    float total_variance = left_variance + right_variance;
    if (total_variance < .00001f)
      break;
    if (((prev_total_variance - total_variance) / total_variance) < .00001f)
      break;
    prev_total_variance = total_variance;
  }
  result[0] = left_child;
  result[1] = right_child;
}